

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffasfm(char *tform,int *dtcode,long *twidth,int *decimals,int *status)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long width;
  float fwidth;
  long longval;
  char temp [71];
  char message [81];
  ulong local_f8;
  float local_ec;
  char *local_e8;
  long local_e0;
  byte local_d8;
  char local_d7;
  char local_d6;
  char local_d5;
  char local_d4 [76];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (dtcode != (int *)0x0) {
    *dtcode = 0;
  }
  if (twidth != (long *)0x0) {
    *twidth = 0;
  }
  if (decimals != (int *)0x0) {
    *decimals = 0;
  }
  pcVar6 = tform + -1;
  do {
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar1 == ' ');
  sVar4 = strlen(pcVar6);
  if (0x46 < sVar4) {
    pcVar6 = "Error: ASCII table TFORM code is too long (ffasfm)";
LAB_00147ac9:
    ffxmsg(5,pcVar6);
    *status = 0x105;
    return 0x105;
  }
  local_e8 = tform;
  strcpy((char *)&local_d8,pcVar6);
  ffupch((char *)&local_d8);
  if (local_d8 == 0) {
    pcVar6 = "Error: ASCII table TFORM code is blank";
    goto LAB_00147ac9;
  }
  if (local_d8 == 0x41) {
    iVar5 = 0x10;
    goto LAB_00147b0b;
  }
  switch(local_d8) {
  case 0x44:
    iVar5 = 0x52;
    break;
  case 0x45:
  case 0x46:
    iVar5 = 0x2a;
    break;
  default:
    snprintf(local_88,0x51,"Illegal ASCII table TFORMn datatype: \'%s\'",local_e8);
    ffxmsg(5,local_88);
    *status = 0x106;
    return 0x106;
  case 0x49:
    iVar5 = 0x29;
    bVar2 = true;
    goto LAB_00147b0e;
  }
LAB_00147b0b:
  bVar2 = false;
LAB_00147b0e:
  if (dtcode != (int *)0x0) {
    *dtcode = iVar5;
  }
  if ((bool)(local_d8 != 0x41 & (bVar2 ^ 1U))) {
    iVar3 = ffc2rr(&local_d7,&local_ec,status);
    if (iVar3 < 1) {
      if (local_ec <= 0.0) goto LAB_00147b71;
      uVar7 = (ulong)local_ec;
      iVar3 = 0x52;
      if (local_d8 != 0x46) {
        iVar3 = iVar5;
      }
      if (7 < (long)uVar7) {
        iVar5 = iVar3;
      }
      pcVar6 = &local_d6;
      if (9 < (long)uVar7) {
        pcVar6 = &local_d5;
      }
      local_f8 = uVar7;
      if (*pcVar6 == '.') {
        pcVar6 = local_d4;
        if ((long)uVar7 < 10) {
          pcVar6 = &local_d5;
        }
        iVar3 = ffc2ii(pcVar6,&local_e0,status);
        if (iVar3 < 1) {
          if (decimals != (int *)0x0) {
            *decimals = (int)local_e0;
          }
          if ((long)uVar7 <= local_e0) {
            *status = 0x105;
          }
          iVar3 = 0x52;
          if (local_d8 != 0x45) {
            iVar3 = iVar5;
          }
          if (6 < local_e0) {
            iVar5 = iVar3;
          }
        }
      }
    }
LAB_00147b6c:
    if (*status < 1) goto LAB_00147ba4;
  }
  else {
    iVar3 = ffc2ii(&local_d7,(long *)&local_f8,status);
    if (0 < iVar3) goto LAB_00147b6c;
    if (0 < (long)local_f8) {
      iVar3 = 0x15;
      if (4 < local_f8) {
        iVar3 = iVar5;
      }
      if (bVar2) {
        iVar5 = iVar3;
      }
      goto LAB_00147b6c;
    }
    local_f8 = 0;
  }
LAB_00147b71:
  *status = 0x105;
  snprintf(local_88,0x51,"Illegal ASCII table TFORMn code: \'%s\'",local_e8);
  ffxmsg(5,local_88);
LAB_00147ba4:
  if (dtcode != (int *)0x0) {
    *dtcode = iVar5;
  }
  if (twidth != (long *)0x0) {
    *twidth = local_f8;
  }
  return *status;
}

Assistant:

int ffasfm(char *tform,    /* I - format code from the TFORMn keyword */
           int *dtcode,    /* O - numerical datatype code */
           long *twidth,   /* O - width of the field, in chars */
           int *decimals,  /* O - number of decimal places (F, E, D format) */
           int *status)    /* IO - error status      */
{
/*
  parse the ASCII table TFORM column format to determine the data
  type, the field width, and number of decimal places (if relevant)
*/
    int ii, datacode;
    long longval, width;
    float fwidth;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (twidth)
        *twidth = 0;

    if (decimals)
        *decimals = 0;

    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (strlen(&tform[ii]) > FLEN_VALUE-1)
    {
       ffpmsg("Error: ASCII table TFORM code is too long (ffasfm)");
       return(*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */


    if (form[0] == 0)
    {
        ffpmsg("Error: ASCII table TFORM code is blank");
        return(*status = BAD_TFORM);
    }

    /*-----------------------------------------------*/
    /*       determine default datatype code         */
    /*-----------------------------------------------*/
    if (form[0] == 'A')
        datacode = TSTRING;
    else if (form[0] == 'I')
        datacode = TLONG;
    else if (form[0] == 'F')
        datacode = TFLOAT;
    else if (form[0] == 'E')
        datacode = TFLOAT;
    else if (form[0] == 'D')
        datacode = TDOUBLE;
    else
    {
        snprintf(message, FLEN_ERRMSG,
                "Illegal ASCII table TFORMn datatype: \'%s\'", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (dtcode)
       *dtcode = datacode;

    form++;  /* point to the start of field width */

    if (datacode == TSTRING || datacode == TLONG)
    { 
        /*-----------------------------------------------*/
        /*              A or I data formats:             */
        /*-----------------------------------------------*/

        if (ffc2ii(form, &width, status) <= 0)  /* read the width field */
        {
            if (width <= 0)
            {
                width = 0;
                *status = BAD_TFORM;
            }
            else
            {                
                /* set to shorter precision if I4 or less */
                if (width <= 4 && datacode == TLONG)
                    datacode = TSHORT;
            }
        }
    }
    else
    {  
        /*-----------------------------------------------*/
        /*              F, E or D data formats:          */
        /*-----------------------------------------------*/

        if (ffc2rr(form, &fwidth, status) <= 0) /* read ww.dd width field */
        {
           if (fwidth <= 0.)
            *status = BAD_TFORM;
          else
          {
            width = (long) fwidth;  /* convert from float to long */

            if (width > 7 && *temp == 'F')
                datacode = TDOUBLE;  /* type double if >7 digits */

            if (width < 10)
                form = form + 1; /* skip 1 digit  */
            else
                form = form + 2; /* skip 2 digits */

            if (form[0] == '.') /* should be a decimal point here */
            {
                form++;  /*  point to start of decimals field */

                if (ffc2ii(form, &longval, status) <= 0) /* read decimals */
                {
                    if (decimals)
                        *decimals = longval;  /* long to short convertion */

                    if (longval >= width)  /* width < no. of decimals */
                        *status = BAD_TFORM; 

                    if (longval > 6 && *temp == 'E')
                        datacode = TDOUBLE;  /* type double if >6 digits */
                }
            }

          }
        }
    }
    if (*status > 0)
    {
        *status = BAD_TFORM;
        snprintf(message,FLEN_ERRMSG,"Illegal ASCII table TFORMn code: \'%s\'", tform);
        ffpmsg(message);
    }

    if (dtcode)
       *dtcode = datacode;

    if (twidth)
       *twidth = width;

    return(*status);
}